

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

void ctemplate_htmlparser::exit_attr(statemachine_ctx *ctx,int start,char chr,int end)

{
  void *pvVar1;
  char *src;
  size_t src_size;
  htmlparser_ctx *html;
  int end_local;
  char chr_local;
  int start_local;
  statemachine_ctx *ctx_local;
  
  pvVar1 = ctx->user;
  if (pvVar1 != (void *)0x0) {
    src = statemachine_stop_record(ctx);
    src_size = statemachine_record_length(ctx);
    nopad_strncpy((char *)((long)pvVar1 + 0x128),src,0x100,src_size);
    tolower_str((char *)((long)pvVar1 + 0x128));
    return;
  }
  __assert_fail("html != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x1f2,"void ctemplate_htmlparser::exit_attr(statemachine_ctx *, int, char, int)");
}

Assistant:

static void exit_attr(statemachine_ctx *ctx, int start, char chr, int end)
{
    htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
    assert(html != NULL);

    nopad_strncpy(html->attr, statemachine_stop_record(ctx),
                  HTMLPARSER_MAX_STRING, statemachine_record_length(ctx));

    tolower_str(html->attr);
}